

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_radix_tree.c
# Opt level: O3

ngx_int_t ngx_radix128tree_insert(ngx_radix_tree_t *tree,u_char *key,u_char *mask,uintptr_t value)

{
  byte bVar1;
  ngx_radix_node_t *pnVar2;
  ngx_radix_node_t *pnVar3;
  byte bVar4;
  long lVar5;
  
  pnVar3 = tree->root;
  if ((char)*mask < '\0') {
    bVar4 = 0x80;
    lVar5 = 0;
    pnVar2 = pnVar3;
    do {
      pnVar3 = (&pnVar2->right)[(key[lVar5] & bVar4) == 0];
      if (pnVar3 == (ngx_radix_node_t *)0x0) goto LAB_0011de8a;
      if (bVar4 < 2) {
        lVar5 = lVar5 + 1;
        bVar4 = 0x80;
        if (lVar5 == 0x10) break;
      }
      else {
        bVar4 = bVar4 >> 1;
      }
      pnVar2 = pnVar3;
    } while ((mask[lVar5] & bVar4) != 0);
  }
  else if (pnVar3 == (ngx_radix_node_t *)0x0) {
    bVar4 = 0x80;
    pnVar2 = (ngx_radix_node_t *)0x0;
    lVar5 = 0;
LAB_0011de8a:
    bVar1 = mask[lVar5] & bVar4;
    pnVar3 = pnVar2;
    while (bVar1 != 0) {
      pnVar2 = ngx_radix_alloc(tree);
      if (pnVar2 == (ngx_radix_node_t *)0x0) {
        return -1;
      }
      pnVar2->right = (ngx_radix_node_t *)0x0;
      pnVar2->left = (ngx_radix_node_t *)0x0;
      pnVar2->parent = pnVar3;
      pnVar2->value = 0xffffffffffffffff;
      (&pnVar3->right)[(key[lVar5] & bVar4) == 0] = pnVar2;
      pnVar3 = pnVar2;
      if (bVar4 < 2) {
        lVar5 = lVar5 + 1;
        bVar4 = 0x80;
        if (lVar5 == 0x10) break;
      }
      else {
        bVar4 = bVar4 >> 1;
      }
      bVar1 = mask[lVar5] & bVar4;
    }
    goto LAB_0011df2e;
  }
  if (pnVar3->value != 0xffffffffffffffff) {
    return -3;
  }
LAB_0011df2e:
  pnVar3->value = value;
  return 0;
}

Assistant:

ngx_int_t
ngx_radix128tree_insert(ngx_radix_tree_t *tree, u_char *key, u_char *mask,
    uintptr_t value)
{
    u_char             bit;
    ngx_uint_t         i;
    ngx_radix_node_t  *node, *next;

    i = 0;
    bit = 0x80;

    node = tree->root;
    next = tree->root;

    while (bit & mask[i]) {
        if (key[i] & bit) {
            next = node->right;

        } else {
            next = node->left;
        }

        if (next == NULL) {
            break;
        }

        bit >>= 1;
        node = next;

        if (bit == 0) {
            if (++i == 16) {
                break;
            }

            bit = 0x80;
        }
    }

    if (next) {
        if (node->value != NGX_RADIX_NO_VALUE) {
            return NGX_BUSY;
        }

        node->value = value;
        return NGX_OK;
    }

    while (bit & mask[i]) {
        next = ngx_radix_alloc(tree);
        if (next == NULL) {
            return NGX_ERROR;
        }

        next->right = NULL;
        next->left = NULL;
        next->parent = node;
        next->value = NGX_RADIX_NO_VALUE;

        if (key[i] & bit) {
            node->right = next;

        } else {
            node->left = next;
        }

        bit >>= 1;
        node = next;

        if (bit == 0) {
            if (++i == 16) {
                break;
            }

            bit = 0x80;
        }
    }

    node->value = value;

    return NGX_OK;
}